

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cc
# Opt level: O2

int EditDistance(StringPiece *s1,StringPiece *s2,bool allow_replacements,int max_edit_distance)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  uint *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  allocator_type local_85;
  int local_84;
  long local_80;
  uint *local_78;
  pointer local_70;
  StringPiece *local_68;
  StringPiece *local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> row;
  
  sVar2 = s1->len_;
  uVar8 = s2->len_;
  local_80 = uVar8 << 0x20;
  local_68 = s1;
  local_60 = s2;
  std::vector<int,_std::allocator<int>_>::vector(&row,local_80 + 0x100000000 >> 0x20,&local_85);
  uVar6 = 0;
  if (0 < (int)uVar8) {
    uVar6 = uVar8 & 0xffffffff;
  }
  for (lVar7 = 1; lVar7 - uVar6 != 1; lVar7 = lVar7 + 1) {
    row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7] = (int)lVar7;
  }
  local_84 = max_edit_distance + 1;
  iVar16 = (int)sVar2;
  if (iVar16 < 1) {
    iVar16 = 0;
  }
  local_50 = (ulong)(iVar16 + 1);
  local_70 = row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_78 = (uint *)(row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1);
  uVar8 = 1;
  do {
    if (uVar8 == local_50) {
      iVar16 = *(int *)((long)row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + (local_80 >> 0x1e));
      break;
    }
    *row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (int)uVar8;
    pcVar3 = local_68->str_;
    pcVar4 = local_60->str_;
    uVar11 = 0;
    uVar12 = uVar8 & 0xffffffff;
    uVar9 = uVar8 & 0xffffffff;
    uVar15 = uVar8 - 1 & 0xffffffff;
    puVar10 = local_78;
    while( true ) {
      if (uVar6 == uVar11) break;
      uVar1 = *puVar10;
      if (allow_replacements) {
        uVar13 = (uint)uVar15 + (uint)(pcVar3[uVar8 - 1] != pcVar4[uVar11]);
        puVar5 = puVar10 + -1;
        if ((int)uVar1 < (int)uVar12) {
          puVar5 = puVar10;
        }
        uVar14 = *puVar5 + 1;
        if ((int)uVar13 <= (int)(*puVar5 + 1)) {
          uVar14 = uVar13;
        }
      }
      else {
        uVar14 = (uint)uVar15;
        if (pcVar3[uVar8 - 1] != pcVar4[uVar11]) {
          puVar5 = puVar10 + -1;
          if ((int)uVar1 < (int)uVar12) {
            puVar5 = puVar10;
          }
          uVar14 = *puVar5 + 1;
        }
      }
      *puVar10 = uVar14;
      if ((int)uVar14 < (int)uVar9) {
        uVar9 = (ulong)uVar14;
      }
      uVar11 = uVar11 + 1;
      puVar10 = puVar10 + 1;
      uVar12 = (ulong)uVar14;
      uVar15 = (ulong)uVar1;
    }
    uVar8 = uVar8 + 1;
  } while ((max_edit_distance == 0) || (iVar16 = local_84, (int)uVar9 <= max_edit_distance));
  local_58 = (ulong)(uint)max_edit_distance;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&row.super__Vector_base<int,_std::allocator<int>_>);
  return iVar16;
}

Assistant:

int EditDistance(const StringPiece& s1,
                 const StringPiece& s2,
                 bool allow_replacements,
                 int max_edit_distance) {
  // The algorithm implemented below is the "classic"
  // dynamic-programming algorithm for computing the Levenshtein
  // distance, which is described here:
  //
  //   http://en.wikipedia.org/wiki/Levenshtein_distance
  //
  // Although the algorithm is typically described using an m x n
  // array, only one row plus one element are used at a time, so this
  // implementation just keeps one vector for the row.  To update one entry,
  // only the entries to the left, top, and top-left are needed.  The left
  // entry is in row[x-1], the top entry is what's in row[x] from the last
  // iteration, and the top-left entry is stored in previous.
  int m = s1.len_;
  int n = s2.len_;

  vector<int> row(n + 1);
  for (int i = 1; i <= n; ++i)
    row[i] = i;

  for (int y = 1; y <= m; ++y) {
    row[0] = y;
    int best_this_row = row[0];

    int previous = y - 1;
    for (int x = 1; x <= n; ++x) {
      int old_row = row[x];
      if (allow_replacements) {
        row[x] = min(previous + (s1.str_[y - 1] == s2.str_[x - 1] ? 0 : 1),
                     min(row[x - 1], row[x]) + 1);
      }
      else {
        if (s1.str_[y - 1] == s2.str_[x - 1])
          row[x] = previous;
        else
          row[x] = min(row[x - 1], row[x]) + 1;
      }
      previous = old_row;
      best_this_row = min(best_this_row, row[x]);
    }

    if (max_edit_distance && best_this_row > max_edit_distance)
      return max_edit_distance + 1;
  }

  return row[n];
}